

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O2

_Bool scan_content(TSLexer *lexer,TSSymbol content_symbol,char end_char,uint n_delim,_Bool interp)

{
  int iVar1;
  bool bVar2;
  undefined3 in_register_00000011;
  _Bool _Var3;
  uint uVar4;
  
  _Var3 = false;
  do {
    iVar1 = lexer->lookahead;
    if (iVar1 == 0) {
      return false;
    }
    (*lexer->mark_end)(lexer);
    uVar4 = n_delim;
    if (interp) {
      if ((iVar1 == 0x24) || (iVar1 == 0x5c)) {
LAB_001528c0:
        lexer->result_symbol = content_symbol;
        return _Var3;
      }
LAB_00152895:
      while( true ) {
        if (uVar4 == 0) {
          bVar2 = !_Var3;
          _Var3 = true;
          if (bVar2) {
            (*lexer->mark_end)(lexer);
            content_symbol = end_char == '\"' | 0xe;
          }
          goto LAB_001528c0;
        }
        if (lexer->lookahead != CONCAT31(in_register_00000011,end_char)) break;
        (*lexer->advance)(lexer,false);
        uVar4 = uVar4 - 1;
      }
    }
    else {
      if (iVar1 != 0x5c) goto LAB_00152895;
      (*lexer->advance)(lexer,false);
      if ((lexer->lookahead == CONCAT31(in_register_00000011,end_char)) ||
         (lexer->lookahead == 0x5c)) goto LAB_001528c0;
    }
    (*lexer->advance)(lexer,false);
    _Var3 = true;
  } while( true );
}

Assistant:

static bool scan_content(TSLexer *lexer, TSSymbol content_symbol, char end_char, unsigned n_delim, bool interp) {
    TSSymbol end_symbol = (end_char == '"') ? END_STR : END_CMD;
    bool has_content = false;
    int32_t next;
    while ((next = lexer->lookahead)) {
        mark_end(lexer);
        if (interp && (next == '$' || next == '\\')) {
            lexer->result_symbol = content_symbol;
            return has_content;
        } else if (next == '\\') {
            // Parse backslash in raw strings (check escaped delimiters and '\\')
            advance(lexer);
            next = lexer->lookahead;
            if (next == end_char || next == '\\') {
                lexer->result_symbol = content_symbol;
                return has_content;
            }
        } else {
            bool is_end_delimiter = true;
            for (unsigned i = 1; i <= n_delim; i++) {
                if (lexer->lookahead == end_char) {
                    advance(lexer);
                } else {
                    is_end_delimiter = false;
                    break;
                }
            }
            if (is_end_delimiter) {
                if (has_content) {
                    lexer->result_symbol = content_symbol;
                    return true;
                } else {
                    mark_end(lexer);
                    lexer->result_symbol = end_symbol;
                    return true;
                }
            }
        }
        advance(lexer);
        has_content = true;
    }
    return false;
}